

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall VmaBlockMetadata_TLSF::Validate(VmaBlockMetadata_TLSF *this)

{
  VmaBlockBufferImageGranularity *this_00;
  VkDeviceSize size;
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  Block *pBVar3;
  Block *pBVar4;
  undefined4 extraout_var_00;
  VkDeviceSize VVar5;
  ulong uVar6;
  Block *pBVar7;
  VkDeviceSize VVar8;
  VkDeviceSize offset;
  bool bVar9;
  ValidationContext validateCtx;
  size_t local_58;
  size_t local_50;
  VkDeviceSize local_48;
  ValidationContext local_40;
  
  iVar1 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[6])();
  if (CONCAT44(extraout_var,iVar1) <= (this->super_VmaBlockMetadata).m_Size) {
    VVar5 = this->m_NullBlock->size;
    if ((ulong)this->m_ListsCount != 0) {
      uVar6 = 0;
      do {
        pBVar4 = this->m_FreeList[uVar6];
        if (pBVar4 != (Block *)0x0) {
          if (pBVar4->prevFree != (Block *)0x0) {
            return false;
          }
          while (pBVar7 = (pBVar4->field_5).nextFree, pBVar7 != (Block *)0x0) {
            if (pBVar7->prevFree == pBVar7) {
              return false;
            }
            bVar9 = pBVar7->prevFree != pBVar4;
            pBVar4 = pBVar7;
            if (bVar9) {
              return false;
            }
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != this->m_ListsCount);
    }
    offset = this->m_NullBlock->offset;
    this_00 = &this->m_GranularityHandler;
    local_40 = VmaBlockBufferImageGranularity::StartValidation
                         (this_00,(this->super_VmaBlockMetadata).m_pAllocationCallbacks,
                          (this->super_VmaBlockMetadata).m_IsVirtual);
    pBVar4 = this->m_NullBlock;
    if (pBVar4->nextPhysical == (Block *)0x0) {
      pBVar7 = pBVar4->prevPhysical;
      local_48 = VVar5;
      if (pBVar7 == (Block *)0x0) {
        local_58 = 0;
        local_50 = 0;
LAB_001b8eb1:
        if ((this->super_VmaBlockMetadata).m_IsVirtual == false) {
          bVar9 = VmaBlockBufferImageGranularity::FinishValidation(this_00,&local_40);
          if (!bVar9) {
            return false;
          }
          if (offset != 0) {
            return false;
          }
        }
        else if (offset != 0) {
          return false;
        }
        if (VVar5 == (this->super_VmaBlockMetadata).m_Size) {
          iVar1 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[6])(this);
          if (local_48 != CONCAT44(extraout_var_00,iVar1)) {
            return false;
          }
          if (local_58 == this->m_AllocCount) {
            return local_50 == this->m_BlocksFreeCount;
          }
          return false;
        }
      }
      else if (pBVar7->nextPhysical == pBVar4) {
        local_50 = 0;
        local_58 = 0;
        VVar8 = offset;
        while( true ) {
          offset = pBVar7->offset;
          size = pBVar7->size;
          if (offset + size != VVar8) break;
          uVar2 = GetListIndex(this,size);
          pBVar4 = this->m_FreeList[uVar2];
          if (pBVar7->prevFree == pBVar7) {
            for (; pBVar4 != (Block *)0x0; pBVar4 = (pBVar4->field_5).nextFree) {
              if (pBVar4 == pBVar7) {
                return false;
              }
            }
            local_58 = local_58 + 1;
            if (((this->super_VmaBlockMetadata).m_IsVirtual == false) &&
               (bVar9 = VmaBlockBufferImageGranularity::Validate(this_00,&local_40,offset,size),
               !bVar9)) {
              return false;
            }
          }
          else {
            if (pBVar4 == (Block *)0x0) {
              return false;
            }
            local_50 = local_50 + 1;
            do {
              pBVar3 = pBVar4;
              if (pBVar3 == pBVar7) break;
              pBVar4 = (pBVar3->field_5).nextFree;
            } while ((pBVar3->field_5).nextFree != (Block *)0x0);
            if (pBVar3 != pBVar7) {
              return false;
            }
            local_48 = local_48 + size;
          }
          VVar5 = VVar5 + size;
          pBVar4 = pBVar7->prevPhysical;
          if (pBVar4 == (Block *)0x0) goto LAB_001b8eb1;
          bVar9 = pBVar4->nextPhysical != pBVar7;
          pBVar7 = pBVar4;
          VVar8 = offset;
          if (bVar9) {
            return false;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool VmaBlockMetadata_TLSF::Validate() const
{
    VMA_VALIDATE(GetSumFreeSize() <= GetSize());

    VkDeviceSize calculatedSize = m_NullBlock->size;
    VkDeviceSize calculatedFreeSize = m_NullBlock->size;
    size_t allocCount = 0;
    size_t freeCount = 0;

    // Check integrity of free lists
    for (uint32_t list = 0; list < m_ListsCount; ++list)
    {
        Block* block = m_FreeList[list];
        if (block != VMA_NULL)
        {
            VMA_VALIDATE(block->IsFree());
            VMA_VALIDATE(block->PrevFree() == VMA_NULL);
            while (block->NextFree())
            {
                VMA_VALIDATE(block->NextFree()->IsFree());
                VMA_VALIDATE(block->NextFree()->PrevFree() == block);
                block = block->NextFree();
            }
        }
    }

    VkDeviceSize nextOffset = m_NullBlock->offset;
    auto validateCtx = m_GranularityHandler.StartValidation(GetAllocationCallbacks(), IsVirtual());

    VMA_VALIDATE(m_NullBlock->nextPhysical == VMA_NULL);
    if (m_NullBlock->prevPhysical)
    {
        VMA_VALIDATE(m_NullBlock->prevPhysical->nextPhysical == m_NullBlock);
    }
    // Check all blocks
    for (Block* prev = m_NullBlock->prevPhysical; prev != VMA_NULL; prev = prev->prevPhysical)
    {
        VMA_VALIDATE(prev->offset + prev->size == nextOffset);
        nextOffset = prev->offset;
        calculatedSize += prev->size;

        uint32_t listIndex = GetListIndex(prev->size);
        if (prev->IsFree())
        {
            ++freeCount;
            // Check if free block belongs to free list
            Block* freeBlock = m_FreeList[listIndex];
            VMA_VALIDATE(freeBlock != VMA_NULL);

            bool found = false;
            do
            {
                if (freeBlock == prev)
                    found = true;

                freeBlock = freeBlock->NextFree();
            } while (!found && freeBlock != VMA_NULL);

            VMA_VALIDATE(found);
            calculatedFreeSize += prev->size;
        }
        else
        {
            ++allocCount;
            // Check if taken block is not on a free list
            Block* freeBlock = m_FreeList[listIndex];
            while (freeBlock)
            {
                VMA_VALIDATE(freeBlock != prev);
                freeBlock = freeBlock->NextFree();
            }

            if (!IsVirtual())
            {
                VMA_VALIDATE(m_GranularityHandler.Validate(validateCtx, prev->offset, prev->size));
            }
        }

        if (prev->prevPhysical)
        {
            VMA_VALIDATE(prev->prevPhysical->nextPhysical == prev);
        }
    }

    if (!IsVirtual())
    {
        VMA_VALIDATE(m_GranularityHandler.FinishValidation(validateCtx));
    }

    VMA_VALIDATE(nextOffset == 0);
    VMA_VALIDATE(calculatedSize == GetSize());
    VMA_VALIDATE(calculatedFreeSize == GetSumFreeSize());
    VMA_VALIDATE(allocCount == m_AllocCount);
    VMA_VALIDATE(freeCount == m_BlocksFreeCount);

    return true;
}